

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inverters.cpp
# Opt level: O3

Option<Kernel::TermList>
Kernel::Rebalancing::Inverters::tryInvertLinMul<Kernel::NumTraits<Kernel::RationalConstantType>>
          (char *ctxt)

{
  anon_class_16_2_d7009eb6 func;
  MaybeUninit<Kernel::TermList> extraout_RDX;
  Option<Kernel::TermList> OVar1;
  char in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffd9;
  char in_stack_ffffffffffffffe0;
  undefined7 in_stack_ffffffffffffffe1;
  InversionContext *in_stack_ffffffffffffffe8;
  
  func.n._1_7_ = in_stack_ffffffffffffffe1;
  func.n._0_1_ = in_stack_ffffffffffffffe0;
  func.ctxt = in_stack_ffffffffffffffe8;
  NumTraits<Kernel::RationalConstantType>::
  ifLinMul<Kernel::Rebalancing::Inverters::tryInvertLinMul<Kernel::NumTraits<Kernel::RationalConstantType>>(Kernel::Rebalancing::InversionContext_const&,Kernel::NumTraits<Kernel::RationalConstantType>)::_lambda(auto:1&,auto:2)_1_>
            ((Term *)CONCAT71(in_stack_ffffffffffffffd9,in_stack_ffffffffffffffd8),func);
  if (in_stack_ffffffffffffffd8 == '\x01') {
    if (in_stack_ffffffffffffffe0 == '\0') {
      *ctxt = '\0';
    }
    else {
      *ctxt = in_stack_ffffffffffffffe0;
      *(InversionContext **)(ctxt + 8) = in_stack_ffffffffffffffe8;
    }
  }
  else {
    ctxt[0] = '\0';
    ctxt[1] = '\0';
    ctxt[2] = '\0';
    ctxt[3] = '\0';
    ctxt[4] = '\0';
    ctxt[5] = '\0';
    ctxt[6] = '\0';
    ctxt[7] = '\0';
    ctxt[8] = '\0';
    ctxt[9] = '\0';
    ctxt[10] = '\0';
    ctxt[0xb] = '\0';
    ctxt[0xc] = '\0';
    ctxt[0xd] = '\0';
    ctxt[0xe] = '\0';
    ctxt[0xf] = '\0';
  }
  OVar1.super_OptionBase<Kernel::TermList>._elem._elem = extraout_RDX._elem;
  OVar1.super_OptionBase<Kernel::TermList>._0_8_ = ctxt;
  return (Option<Kernel::TermList>)OVar1.super_OptionBase<Kernel::TermList>;
}

Assistant:

Option<TermList> tryInvertLinMul(InversionContext const& ctxt, NumTraits n) {
    return asig(n)
      .ifLinMul(&ctxt.topTerm(), [&](auto& c, auto t) { 
          return someIf(c != 0, [&]() { return asig(n).linMul(1/c, ctxt.toWrap()); }); 
      })
      .flatten();
}